

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

int sznet::sz_cond_timewait(sz_cond_t *cond,sz_mutex_t *mutex,uint32_t millisec)

{
  int iVar1;
  long lVar2;
  undefined1 local_38 [8];
  timespec abstime;
  
  clock_gettime(0,(timespec *)local_38);
  lVar2 = (ulong)millisec * 1000000 + abstime.tv_sec;
  local_38 = (undefined1  [8])((long)local_38 + lVar2 / 1000000000);
  abstime.tv_sec = lVar2 % 1000000000;
  iVar1 = pthread_cond_timedwait
                    ((pthread_cond_t *)cond,(pthread_mutex_t *)mutex,(timespec *)local_38);
  return iVar1;
}

Assistant:

int sz_cond_timewait(sz_cond_t* cond, sz_mutex_t* mutex, uint32_t millisec)
{
	struct timespec abstime;
	clock_gettime(CLOCK_REALTIME, &abstime);

	const int64_t kNanoSecondsPerMilliSecond = 1000000;
	const int64_t kNanoSecondsPerSecond = 1000000000;
	int64_t nanoseconds = static_cast<int64_t>(millisec * kNanoSecondsPerMilliSecond);
	abstime.tv_sec += static_cast<time_t>((abstime.tv_nsec + nanoseconds) / kNanoSecondsPerSecond);
	abstime.tv_nsec = static_cast<long>((abstime.tv_nsec + nanoseconds) % kNanoSecondsPerSecond);
	return pthread_cond_timedwait(cond, mutex, &abstime);
}